

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlcBlast.c
# Opt level: O0

void Wlc_BlastFullAdder(Gia_Man_t *pNew,int a,int b,int c,int *pc,int *ps)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  bool bVar5;
  int And2_;
  int And2_1;
  int Xor_1;
  int And1_;
  int And1_1;
  int And2;
  int And1;
  int Xor;
  int fCompl;
  int fUseXor;
  int *ps_local;
  int *pc_local;
  undefined4 local_18;
  int c_local;
  int b_local;
  int a_local;
  Gia_Man_t *pNew_local;
  
  bVar5 = true;
  if ((a != 1) && (bVar5 = true, b != 1)) {
    bVar5 = c == 1;
  }
  pc_local._4_4_ = c;
  local_18 = b;
  c_local = a;
  if (bVar5) {
    c_local = Abc_LitNot(a);
    local_18 = Abc_LitNot(b);
    pc_local._4_4_ = Abc_LitNot(c);
  }
  iVar4 = Gia_ManHashAnd(pNew,c_local,local_18);
  iVar1 = Abc_LitNot(c_local);
  iVar2 = Abc_LitNot(local_18);
  iVar1 = Gia_ManHashAnd(pNew,iVar1,iVar2);
  iVar2 = Abc_LitNot(iVar4);
  iVar1 = Abc_LitNot(iVar1);
  iVar1 = Gia_ManHashAnd(pNew,iVar2,iVar1);
  iVar2 = Gia_ManHashAnd(pNew,pc_local._4_4_,iVar1);
  iVar3 = Abc_LitNot(pc_local._4_4_);
  iVar1 = Abc_LitNot(iVar1);
  iVar1 = Gia_ManHashAnd(pNew,iVar3,iVar1);
  iVar3 = Abc_LitNot(iVar2);
  iVar1 = Abc_LitNot(iVar1);
  iVar1 = Gia_ManHashAnd(pNew,iVar3,iVar1);
  *ps = iVar1;
  iVar4 = Gia_ManHashOr(pNew,iVar4,iVar2);
  *pc = iVar4;
  if (bVar5) {
    iVar4 = Abc_LitNot(*ps);
    *ps = iVar4;
    iVar4 = Abc_LitNot(*pc);
    *pc = iVar4;
  }
  return;
}

Assistant:

void Wlc_BlastFullAdder( Gia_Man_t * pNew, int a, int b, int c, int * pc, int * ps )
{
    int fUseXor = 0;
    int fCompl = (a == 1 || b == 1 || c == 1);
    // propagate complement through the FA - helps generate less redundant logic
    if ( fCompl )
        a = Abc_LitNot(a), b = Abc_LitNot(b), c = Abc_LitNot(c); 
    if ( fUseXor )
    {
        int Xor  = Gia_ManHashXor(pNew, a, b);
        int And1 = Gia_ManHashAnd(pNew, a, b);
        int And2 = Gia_ManHashAnd(pNew, c, Xor);
        *ps      = Gia_ManHashXor(pNew, c, Xor);
        *pc      = Gia_ManHashOr (pNew, And1, And2);
    }
    else
    {
        int And1 = Gia_ManHashAnd(pNew, a, b);
        int And1_= Gia_ManHashAnd(pNew, Abc_LitNot(a), Abc_LitNot(b));
        int Xor  = Gia_ManHashAnd(pNew, Abc_LitNot(And1), Abc_LitNot(And1_));
        int And2 = Gia_ManHashAnd(pNew, c, Xor);
        int And2_= Gia_ManHashAnd(pNew, Abc_LitNot(c), Abc_LitNot(Xor));
        *ps      = Gia_ManHashAnd(pNew, Abc_LitNot(And2), Abc_LitNot(And2_));
        *pc      = Gia_ManHashOr (pNew, And1, And2);
    }
    if ( fCompl )
        *ps = Abc_LitNot(*ps), *pc = Abc_LitNot(*pc); 
}